

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_number_table.cpp
# Opt level: O3

void __thiscall
spvtools::opt::ValueNumberTable::BuildDominatorTreeValueNumberTable(ValueNumberTable *this)

{
  pointer puVar1;
  Function *pFVar2;
  pointer puVar3;
  __uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
  _Var4;
  uint32_t uVar5;
  Module *pMVar6;
  pointer puVar7;
  Instruction *inst;
  Instruction *pIVar8;
  Instruction *pIVar9;
  pointer puVar10;
  
  pMVar6 = (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar8 = (Instruction *)
           ((long)&(pMVar6->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  pIVar9 = *(Instruction **)
            ((long)&(pMVar6->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  if (pIVar9 != pIVar8) {
    do {
      if ((pIVar9->has_result_id_ == true) &&
         (uVar5 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_), uVar5 != 0))
      {
        AssignValueNumber(this,pIVar9);
      }
      pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar9 != pIVar8);
    pMVar6 = (this->context_->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  }
  pIVar8 = &(pMVar6->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar9 = *(Instruction **)
            ((long)&(pMVar6->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>.
                    sentinel_ + 8);
  if (pIVar9 != pIVar8) {
    do {
      if ((pIVar9->has_result_id_ == true) &&
         (uVar5 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_), uVar5 != 0))
      {
        AssignValueNumber(this,pIVar9);
      }
      pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar9 != pIVar8);
    pMVar6 = (this->context_->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  }
  pIVar8 = &(pMVar6->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar9 = *(Instruction **)
            ((long)&(pMVar6->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.
                    sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8);
  if (pIVar9 != pIVar8) {
    do {
      if ((pIVar9->has_result_id_ == true) &&
         (uVar5 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_), uVar5 != 0))
      {
        AssignValueNumber(this,pIVar9);
      }
      pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar9 != pIVar8);
    pMVar6 = (this->context_->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  }
  pIVar8 = &(pMVar6->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar9 = *(Instruction **)
            ((long)&(pMVar6->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>.
                    sentinel_ + 8);
  if (pIVar9 != pIVar8) {
    do {
      if ((pIVar9->has_result_id_ == true) &&
         (uVar5 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_), uVar5 != 0))
      {
        AssignValueNumber(this,pIVar9);
      }
      pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar9 != pIVar8);
    pMVar6 = (this->context_->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  }
  pIVar9 = &(pMVar6->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar8 = (pMVar6->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar8 != pIVar9) {
    do {
      if ((pIVar8->has_result_id_ == true) &&
         (uVar5 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_), uVar5 != 0))
      {
        AssignValueNumber(this,pIVar8);
      }
      pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar8 != pIVar9);
    pMVar6 = (this->context_->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  }
  puVar1 = *(pointer *)
            ((long)&(pMVar6->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                    ._M_impl + 8);
  for (puVar10 = (pMVar6->functions_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar1; puVar10 = puVar10 + 1
      ) {
    pFVar2 = (puVar10->_M_t).
             super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
             .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
    puVar3 = *(pointer *)
              ((long)&(pFVar2->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
              + 8);
    for (puVar7 = *(pointer *)
                   &(pFVar2->blocks_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                    ._M_impl; puVar7 != puVar3; puVar7 = puVar7 + 1) {
      _Var4.
      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
           (puVar7->_M_t).
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
      ;
      for (pIVar9 = *(Instruction **)
                     ((long)_Var4.
                            super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl
                     + 0x20);
          pIVar9 != (Instruction *)
                    ((long)_Var4.
                           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl +
                    0x18);
          pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        if ((pIVar9->has_result_id_ == true) &&
           (uVar5 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_), uVar5 != 0
           )) {
          AssignValueNumber(this,pIVar9);
        }
      }
    }
  }
  return;
}

Assistant:

void ValueNumberTable::BuildDominatorTreeValueNumberTable() {
  // First value number the headers.
  for (auto& inst : context()->annotations()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (auto& inst : context()->capabilities()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (auto& inst : context()->types_values()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (auto& inst : context()->module()->ext_inst_imports()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (auto& inst : context()->module()->ext_inst_debuginfo()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (Function& func : *context()->module()) {
    // For best results we want to traverse the code in reverse post order.
    // This happens naturally because of the forward referencing rules.
    for (BasicBlock& block : func) {
      for (Instruction& inst : block) {
        if (inst.result_id() != 0) {
          AssignValueNumber(&inst);
        }
      }
    }
  }
}